

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

ssize_t __thiscall Instance::write(Instance *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  const_reference this_00;
  uint *puVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  FILE *__stream;
  int local_68;
  int local_64;
  int i_2;
  int j;
  int q;
  int i_1;
  int it;
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> rid;
  int local_20;
  int p;
  int i;
  int t;
  FILE *fout_local;
  Instance *this_local;
  
  __stream = (FILE *)CONCAT44(in_register_00000034,__fd);
  fprintf(__stream,"#INSTANCE_BEGIN#\n");
  fprintf(__stream,"$INSTANCE{\n");
  fprintf(__stream,"%d\n",(ulong)(uint)this->ndims);
  fprintf(__stream,"%d\n",(ulong)(uint)this->nbtypes);
  for (p = 0; p < this->nbtypes; p = p + 1) {
    for (local_20 = 0; local_20 < this->ndims; local_20 = local_20 + 1) {
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&this->Ws,(long)p);
      puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_20);
      fprintf(__stream," %d",(ulong)*puVar2);
    }
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->Cs,(long)p);
    fprintf(__stream," %d",(ulong)*puVar2);
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->Qs,(long)p);
    fprintf(__stream," %d\n",(ulong)*puVar2);
  }
  fprintf(__stream,"%d\n",(ulong)(uint)this->m);
  rid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  sVar3 = std::vector<Item,_std::allocator<Item>_>::size(&this->items);
  std::allocator<int>::allocator(&local_41);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,sVar3,&local_41);
  std::allocator<int>::~allocator(&local_41);
  q = 0;
  while( true ) {
    sVar3 = std::vector<Item,_std::allocator<Item>_>::size(&this->items);
    if ((int)sVar3 <= q) break;
    pvVar4 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->items,(long)q);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)pvVar4->id);
    *pvVar5 = q;
    q = q + 1;
  }
  for (j = 0; j < this->m; j = j + 1) {
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->nopts,(long)j);
    uVar1 = *puVar2;
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->demands,(long)j);
    fprintf(__stream,"%d %d\n",(ulong)uVar1,(ulong)*puVar2);
    i_2 = 0;
    while( true ) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->nopts,(long)j);
      if (*pvVar6 <= i_2) break;
      for (local_64 = 0; local_64 < this->ndims; local_64 = local_64 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_40,
                            (long)rid.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar4 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->items,(long)*pvVar5);
        uVar1 = Item::operator[](pvVar4,local_64);
        fprintf(__stream," %d",(ulong)uVar1);
      }
      fprintf(__stream,"\n");
      rid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           rid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1;
      i_2 = i_2 + 1;
    }
  }
  fprintf(__stream,"};\n");
  fprintf(__stream,"$VTYPE{%c};\n",(ulong)(uint)(int)this->vtype);
  fprintf(__stream,"$CTYPE{");
  for (local_68 = 0; local_68 < this->m; local_68 = local_68 + 1) {
    if (local_68 != 0) {
      fprintf(__stream,",");
    }
    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](&this->ctypes,(long)local_68);
    fprintf(__stream,"%c",(ulong)(uint)(int)*pvVar7);
  }
  fprintf(__stream,"};\n");
  fprintf(__stream,"$METHOD{%d};\n",(ulong)(uint)this->method);
  fprintf(__stream,"$RELAX{%d};\n",(ulong)(this->relax_domains & 1));
  fprintf(__stream,"$BINARY{%d};\n",(ulong)(this->binary & 1));
  fprintf(__stream,"#INSTANCE_END#\n");
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return extraout_RAX;
}

Assistant:

void Instance::write(FILE *fout) const {
	fprintf(fout, "#INSTANCE_BEGIN#\n");
	fprintf(fout, "$INSTANCE{\n");
	fprintf(fout, "%d\n", ndims);

	fprintf(fout, "%d\n", nbtypes);

	for (int t = 0; t < nbtypes; t++) {
		for (int i = 0; i < ndims; i++) {
			fprintf(fout, " %d", Ws[t][i]);
		}
		fprintf(fout, " %d", Cs[t]);
		fprintf(fout, " %d\n", Qs[t]);
	}

	fprintf(fout, "%d\n", m);
	int p = 0;
	std::vector<int> rid(items.size());
	for (int it = 0; it < static_cast<int>(items.size()); it++) {
		rid[items[it].id] = it;
	}
	for (int i = 0; i < m; i++) {
		fprintf(fout, "%d %d\n", nopts[i], demands[i]);
		for (int q = 0; q < nopts[i]; q++) {
			for (int j = 0; j < ndims; j++) {
				fprintf(fout, " %d", items[rid[p]][j]);
			}
			fprintf(fout, "\n");
			p++;
		}
	}
	fprintf(fout, "};\n");

	fprintf(fout, "$VTYPE{%c};\n", vtype);

	fprintf(fout, "$CTYPE{");
	for (int i = 0; i < m; i++) {
		if (i) fprintf(fout, ",");
		fprintf(fout, "%c", ctypes[i]);
	}
	fprintf(fout, "};\n");

	fprintf(fout, "$METHOD{%d};\n", method);

	fprintf(fout, "$RELAX{%d};\n", relax_domains);

	fprintf(fout, "$BINARY{%d};\n", binary);

	fprintf(fout, "#INSTANCE_END#\n");
}